

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
          (DescriptorProto_ExtensionRange *this,DescriptorProto_ExtensionRange *from)

{
  uint uVar1;
  void *pvVar2;
  ExtensionRangeOptions *from_00;
  int32 iVar3;
  LogMessage *other;
  ExtensionRangeOptions *this_00;
  LogMessage local_68;
  LogFinisher local_29;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_ExtensionRange_003c52a8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if (((uVar1 & 1) != 0) && (from->options_ == (ExtensionRangeOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.h"
               ,0x1e59);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((uVar1 & 1) == 0) {
    this_00 = (ExtensionRangeOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_00 = (ExtensionRangeOptions *)operator_new(0x48);
    ExtensionRangeOptions::ExtensionRangeOptions(this_00,from_00);
  }
  this->options_ = this_00;
  iVar3 = from->end_;
  this->start_ = from->start_;
  this->end_ = iVar3;
  return;
}

Assistant:

DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(const DescriptorProto_ExtensionRange& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  ::memcpy(&start_, &from.start_,
    static_cast<size_t>(reinterpret_cast<char*>(&end_) -
    reinterpret_cast<char*>(&start_)) + sizeof(end_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.DescriptorProto.ExtensionRange)
}